

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall
MutableS2ShapeIndex::UpdateFaceEdges
          (MutableS2ShapeIndex *this,int face,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *face_edges,InteriorTracker *tracker)

{
  pointer *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ShapeIdSet *this_01;
  const_reference pvVar4;
  const_reference pvVar5;
  S2CellId local_248;
  uint64 local_240;
  S2CellId local_238;
  S2CellId local_230;
  uint64 local_228;
  undefined1 local_220 [96];
  uint64 local_1c0;
  S2CellId local_1b8;
  uint64 local_1b0;
  S2CellId local_1a8;
  S2CellId local_199;
  S2CellId shrunk_id;
  bool disjoint_from_index;
  undefined1 auStack_188 [8];
  S2PaddedCell pcell;
  S2CellId face_id;
  EdgeAllocator alloc;
  R2Rect local_e0;
  undefined1 local_c0 [8];
  ClippedEdge clipped;
  undefined1 local_90 [4];
  int e;
  R2Rect bound;
  undefined1 local_60 [8];
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  clipped_edges;
  vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  clipped_edge_storage;
  int num_edges;
  InteriorTracker *tracker_local;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
  *face_edges_local;
  int face_local;
  MutableS2ShapeIndex *this_local;
  
  sVar3 = std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          ::size(face_edges);
  iVar2 = (int)sVar3;
  if (iVar2 == 0) {
    this_01 = InteriorTracker::shape_ids(tracker);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty(this_01);
    if (bVar1) {
      return;
    }
  }
  this_00 = &clipped_edges.
             super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>::
  vector((vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          *)this_00);
  std::
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ::vector((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            *)local_60);
  std::vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>::
  reserve((vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
           *)this_00,(long)iVar2);
  std::
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ::reserve((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             *)local_60,(long)iVar2);
  R2Rect::Empty();
  for (clipped.bound.bounds_[1].bounds_.c_[1]._4_4_ = 0;
      clipped.bound.bounds_[1].bounds_.c_[1]._4_4_ < iVar2;
      clipped.bound.bounds_[1].bounds_.c_[1]._4_4_ =
           clipped.bound.bounds_[1].bounds_.c_[1]._4_4_ + 1) {
    ClippedEdge::ClippedEdge((ClippedEdge *)local_c0);
    local_c0 = (undefined1  [8])
               std::
               vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
               ::operator[](face_edges,(long)clipped.bound.bounds_[1].bounds_.c_[1]._4_4_);
    pvVar4 = std::
             vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
             operator[](face_edges,(long)clipped.bound.bounds_[1].bounds_.c_[1]._4_4_);
    pvVar5 = std::
             vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
             operator[](face_edges,(long)clipped.bound.bounds_[1].bounds_.c_[1]._4_4_);
    R2Rect::FromPointPair(&local_e0,&pvVar4->a,&pvVar5->b);
    clipped.bound.bounds_[0].bounds_.c_[1] = local_e0.bounds_[1].bounds_.c_[0];
    clipped.bound.bounds_[1].bounds_.c_[0] = local_e0.bounds_[1].bounds_.c_[1];
    clipped.face_edge = (FaceEdge *)local_e0.bounds_[0].bounds_.c_[0];
    clipped.bound.bounds_[0].bounds_.c_[0] = local_e0.bounds_[0].bounds_.c_[1];
    std::vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
    ::push_back((vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
                 *)&clipped_edges.
                    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_c0);
    alloc.face_edges_.
    super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
                  ::back((vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
                          *)&clipped_edges.
                             super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ::push_back((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 *)local_60,
                (value_type *)
                &alloc.face_edges_.
                 super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    R2Rect::AddRect((R2Rect *)local_90,(R2Rect *)&clipped);
  }
  EdgeAllocator::EdgeAllocator((EdgeAllocator *)&face_id);
  register0x00000000 = S2CellId::FromFace(face);
  pcell._88_8_ = register0x00000000;
  S2PaddedCell::S2PaddedCell((S2PaddedCell *)auStack_188,register0x00000000,kCellPadding);
  shrunk_id.id_._0_1_ = is_first_update(this);
  if (0 < iVar2) {
    local_1a8 = ShrinkToFit(this,(S2PaddedCell *)auStack_188,(R2Rect *)local_90);
    local_199 = local_1a8;
    local_1b0 = (uint64)S2PaddedCell::id((S2PaddedCell *)auStack_188);
    bVar1 = ::operator!=(local_1a8,(S2CellId)local_1b0);
    if (bVar1) {
      local_1b8 = S2CellId::range_min((S2CellId *)&pcell.orientation_);
      local_1c0 = (uint64)S2CellId::range_min(&local_199);
      SkipCellRange(this,local_1b8,(S2CellId)local_1c0,tracker,(EdgeAllocator *)&face_id,
                    (bool)((byte)shrunk_id.id_ & 1));
      local_228 = local_199.id_;
      S2PaddedCell::S2PaddedCell((S2PaddedCell *)local_220,local_199,kCellPadding);
      pcell.middle_.bounds_[1].bounds_.c_[1] = (VType)local_220._80_8_;
      pcell.ij_lo_[0] = local_220._88_4_;
      pcell.ij_lo_[1] = local_220._92_4_;
      pcell.middle_.bounds_[0].bounds_.c_[1] = (VType)local_220._64_8_;
      pcell.middle_.bounds_[1].bounds_.c_[0] = (VType)local_220._72_8_;
      pcell.bound_.bounds_[1].bounds_.c_[1] = (VType)local_220._48_8_;
      pcell.middle_.bounds_[0].bounds_.c_[0] = (VType)local_220._56_8_;
      pcell.bound_.bounds_[0].bounds_.c_[1] = (VType)local_220._32_8_;
      pcell.bound_.bounds_[1].bounds_.c_[0] = (VType)local_220._40_8_;
      pcell.padding_ = (double)local_220._16_8_;
      pcell.bound_.bounds_[0].bounds_.c_[0] = (VType)local_220._24_8_;
      auStack_188 = (undefined1  [8])local_220._0_8_;
      pcell.id_.id_ = local_220._8_8_;
      UpdateEdges(this,(S2PaddedCell *)auStack_188,
                  (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   *)local_60,tracker,(EdgeAllocator *)&face_id,(bool)((byte)shrunk_id.id_ & 1));
      local_238 = S2CellId::range_max(&local_199);
      local_230 = S2CellId::next(&local_238);
      local_248 = S2CellId::range_max((S2CellId *)&pcell.orientation_);
      local_240 = (uint64)S2CellId::next(&local_248);
      SkipCellRange(this,local_230,(S2CellId)local_240,tracker,(EdgeAllocator *)&face_id,
                    (bool)((byte)shrunk_id.id_ & 1));
      goto LAB_0038903b;
    }
  }
  UpdateEdges(this,(S2PaddedCell *)auStack_188,
              (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
               *)local_60,tracker,(EdgeAllocator *)&face_id,(bool)((byte)shrunk_id.id_ & 1));
LAB_0038903b:
  EdgeAllocator::~EdgeAllocator((EdgeAllocator *)&face_id);
  std::
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ::~vector((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             *)local_60);
  std::vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>::
  ~vector((vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
           *)&clipped_edges.
              super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void MutableS2ShapeIndex::UpdateFaceEdges(int face,
                                          const vector<FaceEdge>& face_edges,
                                          InteriorTracker* tracker) {
  int num_edges = face_edges.size();
  if (num_edges == 0 && tracker->shape_ids().empty()) return;

  // Create the initial ClippedEdge for each FaceEdge.  Additional clipped
  // edges are created when edges are split between child cells.  We create
  // two arrays, one containing the edge data and another containing pointers
  // to those edges, so that during the recursion we only need to copy
  // pointers in order to propagate an edge to the correct child.
  vector<ClippedEdge> clipped_edge_storage;
  vector<const ClippedEdge*> clipped_edges;
  clipped_edge_storage.reserve(num_edges);
  clipped_edges.reserve(num_edges);
  R2Rect bound = R2Rect::Empty();
  for (int e = 0; e < num_edges; ++e) {
    ClippedEdge clipped;
    clipped.face_edge = &face_edges[e];
    clipped.bound = R2Rect::FromPointPair(face_edges[e].a, face_edges[e].b);
    clipped_edge_storage.push_back(clipped);
    clipped_edges.push_back(&clipped_edge_storage.back());
    bound.AddRect(clipped.bound);
  }
  // Construct the initial face cell containing all the edges, and then update
  // all the edges in the index recursively.
  EdgeAllocator alloc;
  S2CellId face_id = S2CellId::FromFace(face);
  S2PaddedCell pcell(face_id, kCellPadding);

  // "disjoint_from_index" means that the current cell being processed (and
  // all its descendants) are not already present in the index.
  bool disjoint_from_index = is_first_update();
  if (num_edges > 0) {
    S2CellId shrunk_id = ShrinkToFit(pcell, bound);
    if (shrunk_id != pcell.id()) {
      // All the edges are contained by some descendant of the face cell.  We
      // can save a lot of work by starting directly with that cell, but if we
      // are in the interior of at least one shape then we need to create
      // index entries for the cells we are skipping over.
      SkipCellRange(face_id.range_min(), shrunk_id.range_min(),
                    tracker, &alloc, disjoint_from_index);
      pcell = S2PaddedCell(shrunk_id, kCellPadding);
      UpdateEdges(pcell, &clipped_edges, tracker, &alloc, disjoint_from_index);
      SkipCellRange(shrunk_id.range_max().next(), face_id.range_max().next(),
                    tracker, &alloc, disjoint_from_index);
      return;
    }
  }
  // Otherwise (no edges, or no shrinking is possible), subdivide normally.
  UpdateEdges(pcell, &clipped_edges, tracker, &alloc, disjoint_from_index);
}